

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase84::run(TestCase84 *this)

{
  double dVar1;
  char *pcVar2;
  char cVar3;
  uchar uVar4;
  short sVar5;
  unsigned_short uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  float fVar10;
  DebugExpression<bool> _kjCondition_57;
  DebugExpression<bool> _kjCondition_52;
  undefined4 uStack_240c;
  DebugComparison<double,_double> _kjCondition;
  int local_2268 [4];
  DebugExpression<bool> _kjCondition_15;
  size_t sStack_2250;
  ArrayDisposer *pAStack_2248;
  DebugExpression<bool> _kjCondition_56;
  double local_20a0 [50];
  double local_1f10 [50];
  DebugExpression<bool> _kjCondition_18;
  StringPtr local_1bf0;
  StringPtr local_1be0;
  StringPtr local_1bd0;
  StringPtr local_1bc0;
  StringPtr local_1bb0;
  StringPtr local_1ba0;
  StringPtr local_1b90;
  StringPtr local_1b80;
  StringPtr local_1b70;
  StringPtr local_1b60;
  StringPtr local_1b50;
  StringPtr local_1b40;
  StringPtr local_1b30;
  StringPtr local_1b20;
  StringPtr local_1b10;
  StringPtr local_1b00;
  StringPtr local_1af0;
  StringPtr local_1ae0;
  StringPtr local_1ad0 [426];
  
  __kjCondition_15 = "0";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  bVar9 = _kjCondition.left == 0.0;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 0.0) || (_kjCondition.result = bVar9, NAN(_kjCondition.left))) &&
     (_kjCondition.result = bVar9, Debug::minSeverity < 3)) {
    __kjCondition_15 = "0";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = 0.0;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x55,ERROR,
               "\"failed: expected \" \"(\\\"0\\\"_kj.parseAs<double>()) == (0.0)\", _kjCondition, \"0\"_kj.parseAs<double>(), 0.0"
               ,(char (*) [53])"failed: expected (\"0\"_kj.parseAs<double>()) == (0.0)",
               &_kjCondition,local_20a0,local_1f10);
  }
  __kjCondition_15 = "0.0";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 0.0;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 0.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0.0";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = 0.0;
    Debug::log<char_const(&)[55],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x56,ERROR,
               "\"failed: expected \" \"(\\\"0.0\\\"_kj.parseAs<double>()) == (0.0)\", _kjCondition, \"0.0\"_kj.parseAs<double>(), 0.0"
               ,(char (*) [55])"failed: expected (\"0.0\"_kj.parseAs<double>()) == (0.0)",
               &_kjCondition,local_20a0,local_1f10);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 1.0;
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 1.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = 1.0;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x57,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<double>()) == (1.0)\", _kjCondition, \"1\"_kj.parseAs<double>(), 1.0"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<double>()) == (1.0)",
               &_kjCondition,local_20a0,local_1f10);
  }
  __kjCondition_15 = "1.0";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 1.0;
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 1.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1.0";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = 1.0;
    Debug::log<char_const(&)[55],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x58,ERROR,
               "\"failed: expected \" \"(\\\"1.0\\\"_kj.parseAs<double>()) == (1.0)\", _kjCondition, \"1.0\"_kj.parseAs<double>(), 1.0"
               ,(char (*) [55])"failed: expected (\"1.0\"_kj.parseAs<double>()) == (1.0)",
               &_kjCondition,local_20a0,local_1f10);
  }
  __kjCondition_15 = "1e100";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 1e+100;
  _kjCondition.right = 1e+100;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 1e+100) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1e100";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = 1e+100;
    Debug::log<char_const(&)[59],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x59,ERROR,
               "\"failed: expected \" \"(\\\"1e100\\\"_kj.parseAs<double>()) == (1e100)\", _kjCondition, \"1e100\"_kj.parseAs<double>(), 1e100"
               ,(char (*) [59])"failed: expected (\"1e100\"_kj.parseAs<double>()) == (1e100)",
               &_kjCondition,local_20a0,local_1f10);
  }
  __kjCondition_15 = "inf";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "inf";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5a,ERROR,
               "\"failed: expected \" \"(\\\"inf\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"inf\"_kj.parseAs<double>(), inf()"
               ,(char (*) [57])"failed: expected (\"inf\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "infinity";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "infinity";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5b,ERROR,
               "\"failed: expected \" \"(\\\"infinity\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"infinity\"_kj.parseAs<double>(), inf()"
               ,(char (*) [62])"failed: expected (\"infinity\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "INF";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "INF";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5c,ERROR,
               "\"failed: expected \" \"(\\\"INF\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"INF\"_kj.parseAs<double>(), inf()"
               ,(char (*) [57])"failed: expected (\"INF\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "INFINITY";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "INFINITY";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5d,ERROR,
               "\"failed: expected \" \"(\\\"INFINITY\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"INFINITY\"_kj.parseAs<double>(), inf()"
               ,(char (*) [62])"failed: expected (\"INFINITY\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "1e100000";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1e100000";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5e,ERROR,
               "\"failed: expected \" \"(\\\"1e100000\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"1e100000\"_kj.parseAs<double>(), inf()"
               ,(char (*) [62])"failed: expected (\"1e100000\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "-inf";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-inf";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[59],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5f,ERROR,
               "\"failed: expected \" \"(\\\"-inf\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-inf\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [59])"failed: expected (\"-inf\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "-infinity";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-infinity";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[64],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x60,ERROR,
               "\"failed: expected \" \"(\\\"-infinity\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-infinity\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [64])"failed: expected (\"-infinity\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "-INF";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-INF";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[59],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x61,ERROR,
               "\"failed: expected \" \"(\\\"-INF\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-INF\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [59])"failed: expected (\"-INF\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "-INFINITY";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-INFINITY";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[64],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x62,ERROR,
               "\"failed: expected \" \"(\\\"-INFINITY\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-INFINITY\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [64])"failed: expected (\"-INFINITY\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  __kjCondition_15 = "-1e100000";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  if ((_kjCondition.left > -INFINITY) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-1e100000";
    local_20a0[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[64],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,99,ERROR,
               "\"failed: expected \" \"(\\\"-1e100000\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-1e100000\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [64])"failed: expected (\"-1e100000\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_20a0,(float *)local_1f10);
  }
  _kjCondition.left = (double)anon_var_dwarf_bc3ee;
  _kjCondition.right = 1.97626258336499e-323;
  dVar1 = StringPtr::parseAs<double>((StringPtr *)&_kjCondition);
  pcVar2 = __kjCondition_15;
  _kjCondition_15.value = NAN(dVar1);
  if ((!_kjCondition_15.value) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,100,ERROR,
               "\"failed: expected \" \"isNaN(\\\"nan\\\"_kj.parseAs<double>())\", _kjCondition",
               (char (*) [51])"failed: expected isNaN(\"nan\"_kj.parseAs<double>())",
               &_kjCondition_15);
  }
  _kjCondition.left = (double)anon_var_dwarf_bc41d;
  _kjCondition.right = 1.97626258336499e-323;
  dVar1 = StringPtr::parseAs<double>((StringPtr *)&_kjCondition);
  _kjCondition_15.value = NAN(dVar1);
  if ((!_kjCondition_15.value) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NAN\\\"_kj.parseAs<double>())\", _kjCondition",
               (char (*) [51])"failed: expected isNaN(\"NAN\"_kj.parseAs<double>())",
               &_kjCondition_15);
  }
  _kjCondition.left = (double)anon_var_dwarf_bc43e;
  _kjCondition.right = 1.97626258336499e-323;
  dVar1 = StringPtr::parseAs<double>((StringPtr *)&_kjCondition);
  _kjCondition_15.value = NAN(dVar1);
  if ((!_kjCondition_15.value) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x66,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NaN\\\"_kj.parseAs<double>())\", _kjCondition",
               (char (*) [51])"failed: expected isNaN(\"NaN\"_kj.parseAs<double>())",
               &_kjCondition_15);
  }
  local_1bf0.content.ptr = "";
  local_1bf0.content.size_ = 1;
  StringPtr::parseAs<double>(&local_1bf0);
  __kjCondition_15 = (char *)((ulong)pcVar2 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x67,ERROR,"\"code did not throw: \" \"\\\"\\\"_kj.parseAs<double>()\"",
               (char (*) [44])"code did not throw: \"\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1be0.content.ptr = "a";
  local_1be0.content.size_ = 2;
  StringPtr::parseAs<double>(&local_1be0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x68,ERROR,"\"code did not throw: \" \"\\\"a\\\"_kj.parseAs<double>()\"",
               (char (*) [45])"code did not throw: \"a\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1bd0.content.ptr = "1a";
  local_1bd0.content.size_ = 3;
  StringPtr::parseAs<double>(&local_1bd0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x69,ERROR,"\"code did not throw: \" \"\\\"1a\\\"_kj.parseAs<double>()\"",
               (char (*) [46])"code did not throw: \"1a\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1bc0.content.ptr = "+-1";
  local_1bc0.content.size_ = 4;
  StringPtr::parseAs<double>(&local_1bc0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6a,ERROR,"\"code did not throw: \" \"\\\"+-1\\\"_kj.parseAs<double>()\"",
               (char (*) [47])"code did not throw: \"+-1\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_15 = "1";
  fVar10 = StringPtr::parseAs<float>((StringPtr *)&_kjCondition_15);
  bVar9 = fVar10 == 1.0;
  _kjCondition.left = (double)CONCAT44(_kjCondition.left._4_4_,fVar10);
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((fVar10 != 1.0) || (_kjCondition.result = bVar9, NAN(fVar10))) &&
     (_kjCondition.result = bVar9, Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    fVar10 = StringPtr::parseAs<float>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,fVar10);
    local_20a0[0] = 1.0;
    Debug::log<char_const(&)[52],kj::_::DebugComparison<float,double>&,float,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<float>()) == (1.0)\", _kjCondition, \"1\"_kj.parseAs<float>(), 1.0"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<float>()) == (1.0)",
               (DebugComparison<float,_double> *)&_kjCondition,(float *)local_1f10,local_20a0);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int64_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int64_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<int64_t>()) == (1)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "9223372036854775807";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "9223372036854775807";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = NAN;
    Debug::log<char_const(&)[90],kj::_::DebugComparison<long,long_long>&,long,long_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"(\\\"9223372036854775807\\\"_kj.parseAs<int64_t>()) == (9223372036854775807LL)\", _kjCondition, \"9223372036854775807\"_kj.parseAs<int64_t>(), 9223372036854775807LL"
               ,(char (*) [90])
                "failed: expected (\"9223372036854775807\"_kj.parseAs<int64_t>()) == (9223372036854775807LL)"
               ,(DebugComparison<long,_long_long> *)&_kjCondition,(long *)local_20a0,
               (longlong *)local_1f10);
  }
  __kjCondition_15 = "-9223372036854775808";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = -0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -0.0;
  if ((_kjCondition.left != -0.0) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-9223372036854775808";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = -0.0;
    Debug::
    log<char_const(&)[93],kj::_::DebugComparison<long,unsigned_long_long>&,long,unsigned_long_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x70,ERROR,
               "\"failed: expected \" \"(\\\"-9223372036854775808\\\"_kj.parseAs<int64_t>()) == (-9223372036854775808ULL)\", _kjCondition, \"-9223372036854775808\"_kj.parseAs<int64_t>(), -9223372036854775808ULL"
               ,(char (*) [93])
                "failed: expected (\"-9223372036854775808\"_kj.parseAs<int64_t>()) == (-9223372036854775808ULL)"
               ,(DebugComparison<long,_unsigned_long_long> *)&_kjCondition,(long *)local_20a0,
               (unsigned_long_long *)local_1f10);
  }
  local_1bb0.content.ptr = "9223372036854775808";
  local_1bb0.content.size_ = 0x14;
  StringPtr::parseAs<long>(&local_1bb0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x71,ERROR,
               "\"code did not throw: \" \"\\\"9223372036854775808\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [64])"code did not throw: \"9223372036854775808\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1ba0.content.ptr = "-9223372036854775809";
  local_1ba0.content.size_ = 0x15;
  StringPtr::parseAs<long>(&local_1ba0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x72,ERROR,
               "\"code did not throw: \" \"\\\"-9223372036854775809\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [65])"code did not throw: \"-9223372036854775809\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b90.content.ptr = "";
  local_1b90.content.size_ = 1;
  StringPtr::parseAs<long>(&local_1b90);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x73,ERROR,"\"code did not throw: \" \"\\\"\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [45])"code did not throw: \"\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b80.content.ptr = "a";
  local_1b80.content.size_ = 2;
  StringPtr::parseAs<long>(&local_1b80);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x74,ERROR,"\"code did not throw: \" \"\\\"a\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [46])"code did not throw: \"a\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b70.content.ptr = "1a";
  local_1b70.content.size_ = 3;
  StringPtr::parseAs<long>(&local_1b70);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x75,ERROR,"\"code did not throw: \" \"\\\"1a\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [47])"code did not throw: \"1a\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b60.content.ptr = "+-1";
  local_1b60.content.size_ = 4;
  StringPtr::parseAs<long>(&local_1b60);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x76,ERROR,"\"code did not throw: \" \"\\\"+-1\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [48])"code did not throw: \"+-1\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_15 = "010";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  bVar9 = _kjCondition.left == 4.94065645841247e-323;
  _kjCondition.result = bVar9;
  if ((!bVar9) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "010";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,10);
    Debug::log<char_const(&)[55],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"010\\\"_kj.parseAs<int64_t>()) == (10)\", _kjCondition, \"010\"_kj.parseAs<int64_t>(), 10"
               ,(char (*) [55])"failed: expected (\"010\"_kj.parseAs<int64_t>()) == (10)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "0010";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0010";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,10);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"(\\\"0010\\\"_kj.parseAs<int64_t>()) == (10)\", _kjCondition, \"0010\"_kj.parseAs<int64_t>(), 10"
               ,(char (*) [56])"failed: expected (\"0010\"_kj.parseAs<int64_t>()) == (10)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "0x10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 7.90505033345994e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0x10";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x10);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(\\\"0x10\\\"_kj.parseAs<int64_t>()) == (16)\", _kjCondition, \"0x10\"_kj.parseAs<int64_t>(), 16"
               ,(char (*) [56])"failed: expected (\"0x10\"_kj.parseAs<int64_t>()) == (16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "0X10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 7.90505033345994e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0X10";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x10);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(\\\"0X10\\\"_kj.parseAs<int64_t>()) == (16)\", _kjCondition, \"0X10\"_kj.parseAs<int64_t>(), 16"
               ,(char (*) [56])"failed: expected (\"0X10\"_kj.parseAs<int64_t>()) == (16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "-010";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff6);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-010";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xfffffff6);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"(\\\"-010\\\"_kj.parseAs<int64_t>()) == (-10)\", _kjCondition, \"-010\"_kj.parseAs<int64_t>(), -10"
               ,(char (*) [57])"failed: expected (\"-010\"_kj.parseAs<int64_t>()) == (-10)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "-0x10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff0);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-0x10";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xfffffff0);
    Debug::log<char_const(&)[58],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"(\\\"-0x10\\\"_kj.parseAs<int64_t>()) == (-16)\", _kjCondition, \"-0x10\"_kj.parseAs<int64_t>(), -16"
               ,(char (*) [58])"failed: expected (\"-0x10\"_kj.parseAs<int64_t>()) == (-16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "-0X10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff0);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-0X10";
    local_20a0[0] = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xfffffff0);
    Debug::log<char_const(&)[58],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7d,ERROR,
               "\"failed: expected \" \"(\\\"-0X10\\\"_kj.parseAs<int64_t>()) == (-16)\", _kjCondition, \"-0X10\"_kj.parseAs<int64_t>(), -16"
               ,(char (*) [58])"failed: expected (\"-0X10\"_kj.parseAs<int64_t>()) == (-16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    local_20a0[0] = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,1);
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_long,int>&,unsigned_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint64_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint64_t>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<uint64_t>()) == (1)",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition,(unsigned_long *)local_20a0,
               (int *)local_1f10);
  }
  __kjCondition_15 = "0";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0.0;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0";
    local_20a0[0] = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)((ulong)local_1f10[0] & 0xffffffff00000000);
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_long,int>&,unsigned_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"(\\\"0\\\"_kj.parseAs<uint64_t>()) == (0)\", _kjCondition, \"0\"_kj.parseAs<uint64_t>(), 0"
               ,(char (*) [53])"failed: expected (\"0\"_kj.parseAs<uint64_t>()) == (0)",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition,(unsigned_long *)local_20a0,
               (int *)local_1f10);
  }
  __kjCondition_15 = "18446744073709551615";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = -NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((_kjCondition.left != -NAN) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "18446744073709551615";
    local_20a0[0] = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = -NAN;
    Debug::
    log<char_const(&)[94],kj::_::DebugComparison<unsigned_long,unsigned_long_long>&,unsigned_long,unsigned_long_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x81,ERROR,
               "\"failed: expected \" \"(\\\"18446744073709551615\\\"_kj.parseAs<uint64_t>()) == (18446744073709551615ULL)\", _kjCondition, \"18446744073709551615\"_kj.parseAs<uint64_t>(), 18446744073709551615ULL"
               ,(char (*) [94])
                "failed: expected (\"18446744073709551615\"_kj.parseAs<uint64_t>()) == (18446744073709551615ULL)"
               ,(DebugComparison<unsigned_long,_unsigned_long_long> *)&_kjCondition,
               (unsigned_long *)local_20a0,(unsigned_long_long *)local_1f10);
  }
  local_1b50.content.ptr = "-1";
  local_1b50.content.size_ = 3;
  StringPtr::parseAs<unsigned_long>(&local_1b50);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x82,ERROR,"\"code did not throw: \" \"\\\"-1\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [48])"code did not throw: \"-1\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b40.content.ptr = "18446744073709551616";
  local_1b40.content.size_ = 0x15;
  StringPtr::parseAs<unsigned_long>(&local_1b40);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x83,ERROR,
               "\"code did not throw: \" \"\\\"18446744073709551616\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [66])"code did not throw: \"18446744073709551616\"_kj.parseAs<uint64_t>()")
    ;
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b30.content.ptr = "";
  local_1b30.content.size_ = 1;
  StringPtr::parseAs<unsigned_long>(&local_1b30);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x84,ERROR,"\"code did not throw: \" \"\\\"\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [46])"code did not throw: \"\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b20.content.ptr = "a";
  local_1b20.content.size_ = 2;
  StringPtr::parseAs<unsigned_long>(&local_1b20);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x85,ERROR,"\"code did not throw: \" \"\\\"a\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [47])"code did not throw: \"a\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b10.content.ptr = "1a";
  local_1b10.content.size_ = 3;
  StringPtr::parseAs<unsigned_long>(&local_1b10);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x86,ERROR,"\"code did not throw: \" \"\\\"1a\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [48])"code did not throw: \"1a\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1b00.content.ptr = "+-1";
  local_1b00.content.size_ = 4;
  StringPtr::parseAs<unsigned_long>(&local_1b00);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x87,ERROR,"\"code did not throw: \" \"\\\"+-1\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [49])"code did not throw: \"+-1\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_15 = "1";
  iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(1,iVar7);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == 1);
  if ((iVar7 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
    local_20a0[0] = (double)CONCAT44(local_20a0[0]._4_4_,iVar7);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x89,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int32_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int32_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<int32_t>()) == (1)",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "2147483647";
  iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(0x7fffffff,iVar7);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == 0x7fffffff);
  if ((iVar7 != 0x7fffffff) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "2147483647";
    iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
    local_20a0[0] = (double)CONCAT44(local_20a0[0]._4_4_,iVar7);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0x7fffffff);
    Debug::log<char_const(&)[70],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8a,ERROR,
               "\"failed: expected \" \"(\\\"2147483647\\\"_kj.parseAs<int32_t>()) == (2147483647)\", _kjCondition, \"2147483647\"_kj.parseAs<int32_t>(), 2147483647"
               ,(char (*) [70])
                "failed: expected (\"2147483647\"_kj.parseAs<int32_t>()) == (2147483647)",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)local_20a0,(int *)local_1f10);
  }
  __kjCondition_15 = "-2147483648";
  iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(_kjCondition.left._4_4_,iVar7);
  _kjCondition.right = -NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition._32_8_ = _kjCondition._32_8_ & 0xffffffffffffff00;
  if (Debug::minSeverity < 3) {
    __kjCondition_15 = "-2147483648";
    iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,iVar7);
    local_20a0[0] = -NAN;
    Debug::log<char_const(&)[72],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8b,ERROR,
               "\"failed: expected \" \"(\\\"-2147483648\\\"_kj.parseAs<int32_t>()) == (-2147483648)\", _kjCondition, \"-2147483648\"_kj.parseAs<int32_t>(), -2147483648"
               ,(char (*) [72])
                "failed: expected (\"-2147483648\"_kj.parseAs<int32_t>()) == (-2147483648)",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)local_1f10,(long *)local_20a0);
  }
  local_1af0.content.ptr = "2147483648";
  local_1af0.content.size_ = 0xb;
  StringPtr::parseAs<int>(&local_1af0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8c,ERROR,"\"code did not throw: \" \"\\\"2147483648\\\"_kj.parseAs<int32_t>()\"",
               (char (*) [55])"code did not throw: \"2147483648\"_kj.parseAs<int32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_1ae0.content.ptr = "-2147483649";
  local_1ae0.content.size_ = 0xc;
  StringPtr::parseAs<int>(&local_1ae0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8d,ERROR,"\"code did not throw: \" \"\\\"-2147483649\\\"_kj.parseAs<int32_t>()\"",
               (char (*) [56])"code did not throw: \"-2147483649\"_kj.parseAs<int32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_15 = "1";
  uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(1,uVar8);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
  if ((uVar8 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
    local_20a0[0] = (double)CONCAT44(local_20a0[0]._4_4_,uVar8);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,1);
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,int>&,unsigned_int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint32_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint32_t>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<uint32_t>()) == (1)",
               (DebugComparison<unsigned_int,_int> *)&_kjCondition,(uint *)local_20a0,
               (int *)local_1f10);
  }
  __kjCondition_15 = "0";
  uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)(ulong)uVar8;
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 0);
  if ((uVar8 != 0) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0";
    uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
    local_20a0[0] = (double)CONCAT44(local_20a0[0]._4_4_,uVar8);
    local_1f10[0] = (double)((ulong)local_1f10[0] & 0xffffffff00000000);
    Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(\\\"0\\\"_kj.parseAs<uint32_t>()) == (0U)\", _kjCondition, \"0\"_kj.parseAs<uint32_t>(), 0U"
               ,(char (*) [54])"failed: expected (\"0\"_kj.parseAs<uint32_t>()) == (0U)",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)local_20a0,
               (uint *)local_1f10);
  }
  __kjCondition_15 = "4294967295";
  uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(0xffffffff,uVar8);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 0xffffffff);
  if ((uVar8 != 0xffffffff) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "4294967295";
    uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
    local_20a0[0] = (double)CONCAT44(local_20a0[0]._4_4_,uVar8);
    local_1f10[0] = (double)CONCAT44(local_1f10[0]._4_4_,0xffffffff);
    Debug::
    log<char_const(&)[72],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(\\\"4294967295\\\"_kj.parseAs<uint32_t>()) == (4294967295U)\", _kjCondition, \"4294967295\"_kj.parseAs<uint32_t>(), 4294967295U"
               ,(char (*) [72])
                "failed: expected (\"4294967295\"_kj.parseAs<uint32_t>()) == (4294967295U)",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)local_20a0,
               (uint *)local_1f10);
  }
  local_1ad0[0].content.ptr = "-1";
  local_1ad0[0].content.size_ = 3;
  StringPtr::parseAs<unsigned_int>(local_1ad0);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x92,ERROR,"\"code did not throw: \" \"\\\"-1\\\"_kj.parseAs<uint32_t>()\"",
               (char (*) [48])"code did not throw: \"-1\"_kj.parseAs<uint32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_56 = "4294967296";
  StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_56);
  __kjCondition_15 = (char *)((ulong)__kjCondition_15 & 0xffffffffffffff00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x93,ERROR,"\"code did not throw: \" \"\\\"4294967296\\\"_kj.parseAs<uint32_t>()\"",
               (char (*) [56])"code did not throw: \"4294967296\"_kj.parseAs<uint32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_15 = "1";
  sVar5 = StringPtr::parseAs<short>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,sVar5);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,sVar5 == 1);
  if ((sVar5 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    sVar5 = StringPtr::parseAs<short>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_2_ = sVar5;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<short,int>&,short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x95,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int16_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int16_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<int16_t>()) == (1)",
               (DebugComparison<short,_int> *)&_kjCondition,(short *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  uVar6 = StringPtr::parseAs<unsigned_short>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,uVar6);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar6 == 1);
  if ((uVar6 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    uVar6 = StringPtr::parseAs<unsigned_short>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_2_ = uVar6;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_short,int>&,unsigned_short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint16_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint16_t>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<uint16_t>()) == (1)",
               (DebugComparison<unsigned_short,_int> *)&_kjCondition,(unsigned_short *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  cVar3 = StringPtr::parseAs<signed_char>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,cVar3);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar3 == '\x01');
  if ((cVar3 != '\x01') && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    cVar3 = StringPtr::parseAs<signed_char>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_1_ = cVar3;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[51],kj::_::DebugComparison<signed_char,int>&,signed_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x97,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int8_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int8_t>(), 1"
               ,(char (*) [51])"failed: expected (\"1\"_kj.parseAs<int8_t>()) == (1)",
               (DebugComparison<signed_char,_int> *)&_kjCondition,(char *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  uVar4 = StringPtr::parseAs<unsigned_char>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,uVar4);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar4 == '\x01');
  if ((uVar4 != '\x01') && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    uVar4 = StringPtr::parseAs<unsigned_char>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_1_ = uVar4;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<unsigned_char,int>&,unsigned_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x98,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint8_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint8_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<uint8_t>()) == (1)",
               (DebugComparison<unsigned_char,_int> *)&_kjCondition,(uchar *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  cVar3 = StringPtr::parseAs<char>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,cVar3);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar3 == '\x01');
  if ((cVar3 != '\x01') && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    cVar3 = StringPtr::parseAs<char>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_1_ = cVar3;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[49],kj::_::DebugComparison<char,int>&,char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x99,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<char>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<char>(), 1"
               ,(char (*) [49])"failed: expected (\"1\"_kj.parseAs<char>()) == (1)",
               (DebugComparison<char,_int> *)&_kjCondition,(char *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  cVar3 = StringPtr::parseAs<signed_char>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,cVar3);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar3 == '\x01');
  if ((cVar3 != '\x01') && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    cVar3 = StringPtr::parseAs<signed_char>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_1_ = cVar3;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<signed_char,int>&,signed_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9a,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<signed char>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<signed char>(), 1"
               ,(char (*) [56])"failed: expected (\"1\"_kj.parseAs<signed char>()) == (1)",
               (DebugComparison<signed_char,_int> *)&_kjCondition,(char *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  uVar4 = StringPtr::parseAs<unsigned_char>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,uVar4);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar4 == '\x01');
  if ((uVar4 != '\x01') && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    uVar4 = StringPtr::parseAs<unsigned_char>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_1_ = uVar4;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[58],kj::_::DebugComparison<unsigned_char,int>&,unsigned_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9b,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned char>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned char>(), 1"
               ,(char (*) [58])"failed: expected (\"1\"_kj.parseAs<unsigned char>()) == (1)",
               (DebugComparison<unsigned_char,_int> *)&_kjCondition,(uchar *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  sVar5 = StringPtr::parseAs<short>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,sVar5);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,sVar5 == 1);
  if ((sVar5 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    sVar5 = StringPtr::parseAs<short>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_2_ = sVar5;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[50],kj::_::DebugComparison<short,int>&,short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9c,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<short>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<short>(), 1"
               ,(char (*) [50])"failed: expected (\"1\"_kj.parseAs<short>()) == (1)",
               (DebugComparison<short,_int> *)&_kjCondition,(short *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  uVar6 = StringPtr::parseAs<unsigned_short>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,uVar6);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar6 == 1);
  if ((uVar6 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    uVar6 = StringPtr::parseAs<unsigned_short>((StringPtr *)&_kjCondition_15);
    local_2268[0]._0_2_ = uVar6;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[59],kj::_::DebugComparison<unsigned_short,int>&,unsigned_short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9d,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned short>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned short>(), 1"
               ,(char (*) [59])"failed: expected (\"1\"_kj.parseAs<unsigned short>()) == (1)",
               (DebugComparison<unsigned_short,_int> *)&_kjCondition,(unsigned_short *)local_2268,
               (int *)&_kjCondition_52);
  }
  __kjCondition_15 = "1";
  iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(1,iVar7);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == 1);
  if ((iVar7 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_15);
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,iVar7);
    local_2268[0] = 1;
    Debug::log<char_const(&)[48],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9e,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int>(), 1"
               ,(char (*) [48])"failed: expected (\"1\"_kj.parseAs<int>()) == (1)",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_52,local_2268);
  }
  __kjCondition_15 = "1";
  uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
  _kjCondition.left = (double)CONCAT44(1,uVar8);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
  if ((uVar8 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    uVar8 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_15);
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,uVar8);
    local_2268[0] = 1;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,int>&,unsigned_int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9f,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<unsigned>()) == (1)",
               (DebugComparison<unsigned_int,_int> *)&_kjCondition,(uint *)&_kjCondition_52,
               local_2268);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  bVar9 = _kjCondition.left == 4.94065645841247e-324;
  _kjCondition.result = bVar9;
  if ((!bVar9) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    __kjCondition_52 = (char *)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_15);
    local_2268[0] = 1;
    Debug::log<char_const(&)[49],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa0,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<long>(), 1"
               ,(char (*) [49])"failed: expected (\"1\"_kj.parseAs<long>()) == (1)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_52,local_2268);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    __kjCondition_52 = (char *)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_15);
    local_2268[0] = 1;
    Debug::log<char_const(&)[58],kj::_::DebugComparison<unsigned_long,int>&,unsigned_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa1,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned long>(), 1"
               ,(char (*) [58])"failed: expected (\"1\"_kj.parseAs<unsigned long>()) == (1)",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_52,local_2268);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<long_long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    __kjCondition_52 = (char *)StringPtr::parseAs<long_long>((StringPtr *)&_kjCondition_15);
    local_2268[0] = 1;
    Debug::log<char_const(&)[54],kj::_::DebugComparison<long_long,int>&,long_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa2,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<long long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<long long>(), 1"
               ,(char (*) [54])"failed: expected (\"1\"_kj.parseAs<long long>()) == (1)",
               (DebugComparison<long_long,_int> *)&_kjCondition,(longlong *)&_kjCondition_52,
               local_2268);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long_long>((StringPtr *)&_kjCondition_15);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((_kjCondition.left != 4.94065645841247e-324) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    __kjCondition_52 = (char *)StringPtr::parseAs<unsigned_long_long>((StringPtr *)&_kjCondition_15)
    ;
    local_2268[0] = 1;
    Debug::
    log<char_const(&)[63],kj::_::DebugComparison<unsigned_long_long,int>&,unsigned_long_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned long long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned long long>(), 1"
               ,(char (*) [63])"failed: expected (\"1\"_kj.parseAs<unsigned long long>()) == (1)",
               (DebugComparison<unsigned_long_long,_int> *)&_kjCondition,
               (unsigned_long_long *)&_kjCondition_52,local_2268);
  }
  sStack_2250 = 2;
  heapString((String *)&_kjCondition_15,"1",1);
  __kjCondition_52 = __kjCondition_15;
  iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_52);
  pcVar2 = __kjCondition_15;
  _kjCondition.left = (double)CONCAT44(1,iVar7);
  _kjCondition.right = (double)anon_var_dwarf_1cf81;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == 1);
  if (__kjCondition_15 != (char *)0x0) {
    __kjCondition_15 = (char *)0x0;
    sStack_2250 = 0;
    (**pAStack_2248->_vptr_ArrayDisposer)(pAStack_2248,pcVar2,1,2,2,0);
  }
  if (((char)_kjCondition.op.content.size_ == '\0') && (Debug::minSeverity < 3)) {
    heapString((String *)&_kjCondition_15,"1",1);
    __kjCondition_52 = __kjCondition_15;
    if (sStack_2250 == 0) {
      __kjCondition_52 = "";
    }
    iVar7 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_52);
    local_2268[0] = iVar7;
    __kjCondition_52 = (char *)CONCAT44(uStack_240c,1);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(heapString(\\\"1\\\").parseAs<int>()) == (1)\", _kjCondition, heapString(\"1\").parseAs<int>(), 1"
               ,(char (*) [57])"failed: expected (heapString(\"1\").parseAs<int>()) == (1)",
               (DebugComparison<int,_int> *)&_kjCondition,local_2268,(int *)&_kjCondition_52);
    pcVar2 = __kjCondition_15;
    if (__kjCondition_15 != (char *)0x0) {
      __kjCondition_15 = (char *)0x0;
      (**pAStack_2248->_vptr_ArrayDisposer)(pAStack_2248,pcVar2,1,sStack_2250,sStack_2250,0);
    }
  }
  return;
}

Assistant:

TEST(String, parseAs) {
  EXPECT_EQ("0"_kj.parseAs<double>(), 0.0);
  EXPECT_EQ("0.0"_kj.parseAs<double>(), 0.0);
  EXPECT_EQ("1"_kj.parseAs<double>(), 1.0);
  EXPECT_EQ("1.0"_kj.parseAs<double>(), 1.0);
  EXPECT_EQ("1e100"_kj.parseAs<double>(), 1e100);
  EXPECT_EQ("inf"_kj.parseAs<double>(), inf());
  EXPECT_EQ("infinity"_kj.parseAs<double>(), inf());
  EXPECT_EQ("INF"_kj.parseAs<double>(), inf());
  EXPECT_EQ("INFINITY"_kj.parseAs<double>(), inf());
  EXPECT_EQ("1e100000"_kj.parseAs<double>(), inf());
  EXPECT_EQ("-inf"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-infinity"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-INF"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-INFINITY"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-1e100000"_kj.parseAs<double>(), -inf());
  EXPECT_TRUE(isNaN("nan"_kj.parseAs<double>()));
  EXPECT_TRUE(isNaN("NAN"_kj.parseAs<double>()));
  EXPECT_TRUE(isNaN("NaN"_kj.parseAs<double>()));
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", ""_kj.parseAs<double>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "a"_kj.parseAs<double>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "1a"_kj.parseAs<double>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "+-1"_kj.parseAs<double>());

  EXPECT_EQ("1"_kj.parseAs<float>(), 1.0);

  EXPECT_EQ("1"_kj.parseAs<int64_t>(), 1);
  EXPECT_EQ("9223372036854775807"_kj.parseAs<int64_t>(), 9223372036854775807LL);
  EXPECT_EQ("-9223372036854775808"_kj.parseAs<int64_t>(), -9223372036854775808ULL);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "9223372036854775808"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-9223372036854775809"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", ""_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "a"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "1a"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "+-1"_kj.parseAs<int64_t>());
  EXPECT_EQ("010"_kj.parseAs<int64_t>(), 10);
  EXPECT_EQ("0010"_kj.parseAs<int64_t>(), 10);
  EXPECT_EQ("0x10"_kj.parseAs<int64_t>(), 16);
  EXPECT_EQ("0X10"_kj.parseAs<int64_t>(), 16);
  EXPECT_EQ("-010"_kj.parseAs<int64_t>(), -10);
  EXPECT_EQ("-0x10"_kj.parseAs<int64_t>(), -16);
  EXPECT_EQ("-0X10"_kj.parseAs<int64_t>(), -16);

  EXPECT_EQ("1"_kj.parseAs<uint64_t>(), 1);
  EXPECT_EQ("0"_kj.parseAs<uint64_t>(), 0);
  EXPECT_EQ("18446744073709551615"_kj.parseAs<uint64_t>(), 18446744073709551615ULL);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-1"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "18446744073709551616"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", ""_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "a"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "1a"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "+-1"_kj.parseAs<uint64_t>());

  EXPECT_EQ("1"_kj.parseAs<int32_t>(), 1);
  EXPECT_EQ("2147483647"_kj.parseAs<int32_t>(), 2147483647);
  EXPECT_EQ("-2147483648"_kj.parseAs<int32_t>(), -2147483648);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "2147483648"_kj.parseAs<int32_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-2147483649"_kj.parseAs<int32_t>());

  EXPECT_EQ("1"_kj.parseAs<uint32_t>(), 1);
  EXPECT_EQ("0"_kj.parseAs<uint32_t>(), 0U);
  EXPECT_EQ("4294967295"_kj.parseAs<uint32_t>(), 4294967295U);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-1"_kj.parseAs<uint32_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "4294967296"_kj.parseAs<uint32_t>());

  EXPECT_EQ("1"_kj.parseAs<int16_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<uint16_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<int8_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<uint8_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<char>(), 1);
  EXPECT_EQ("1"_kj.parseAs<signed char>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned char>(), 1);
  EXPECT_EQ("1"_kj.parseAs<short>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned short>(), 1);
  EXPECT_EQ("1"_kj.parseAs<int>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned>(), 1);
  EXPECT_EQ("1"_kj.parseAs<long>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned long>(), 1);
  EXPECT_EQ("1"_kj.parseAs<long long>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned long long>(), 1);

  EXPECT_EQ(heapString("1").parseAs<int>(), 1);
}